

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::FieldDescriptor::CopyJsonNameTo(FieldDescriptor *this,FieldDescriptorProto *proto)

{
  byte bVar1;
  string *psVar2;
  Arena *arena;
  
  psVar2 = this->all_names_;
  bVar1 = this->field_0x3;
  (proto->field_0)._impl_._has_bits_.has_bits_[0] =
       (proto->field_0)._impl_._has_bits_.has_bits_[0] | 0x10;
  arena = (Arena *)(proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  internal::ArenaStringPtr::Set<>
            (&(proto->field_0)._impl_.json_name_,
             (string *)((long)&(psVar2->_M_dataplus)._M_p + (ulong)(bVar1 & 0x70) * 2),arena);
  return;
}

Assistant:

void FieldDescriptor::CopyJsonNameTo(FieldDescriptorProto* proto) const {
  proto->set_json_name(json_name());
}